

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::prioritize_piece_list
          (torrent *this,
          vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
          *pieces)

{
  bool bVar1;
  bool was_finished_00;
  bool bVar2;
  reference ppVar3;
  element_type *this_00;
  pointer this_01;
  bool local_59;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_48;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_44;
  reference local_40;
  pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>
  *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  *__range2;
  bool was_finished;
  bool filter_updated;
  vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  *pieces_local;
  torrent *this_local;
  
  bVar1 = is_seed(this);
  if (!bVar1) {
    need_picker(this);
    bVar1 = false;
    was_finished_00 = is_finished(this);
    __end2 = ::std::
             vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
             ::begin(pieces);
    p = (pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>
         *)::std::
           vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
           ::end(pieces);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_*,_std::vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>_>
                                       *)&p), bVar2) {
      ppVar3 = __gnu_cxx::
               __normal_iterator<const_std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_*,_std::vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>_>
               ::operator*(&__end2);
      local_40 = ppVar3;
      strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_44,0);
      bVar2 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                        ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)ppVar3,
                         &local_44);
      ppVar3 = local_40;
      local_59 = true;
      if (!bVar2) {
        this_00 = ::std::
                  __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&(this->super_torrent_hot_members).m_torrent_file);
        local_48.m_val = (int)torrent_info::end_piece(this_00);
        bVar2 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                          ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)ppVar3,
                           &local_48);
        local_59 = true;
        if (!bVar2) {
          local_59 = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::
                     operator>(&local_40->second,
                               (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>
                                *)&top_priority);
        }
      }
      if (local_59 == false) {
        this_01 = ::std::
                  unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                  ::operator->(&(this->super_torrent_hot_members).m_picker);
        bVar2 = piece_picker::set_piece_priority
                          (this_01,(piece_index_t)(local_40->first).m_val,
                           (download_priority_t)(local_40->second).m_val);
        bVar1 = bVar1 || bVar2;
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_*,_std::vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>_>
      ::operator++(&__end2);
    }
    update_gauge(this);
    if (bVar1) {
      set_need_save_resume(this,(resume_data_flags_t)0x20);
      update_peer_interest(this,was_finished_00);
    }
    state_updated(this);
  }
  return;
}

Assistant:

void torrent::prioritize_piece_list(std::vector<std::pair<piece_index_t
		, download_priority_t>> const& pieces)
	{
		INVARIANT_CHECK;

		// this call is only valid on torrents with metadata
		TORRENT_ASSERT(valid_metadata());
		if (is_seed()) return;

		need_picker();

		bool filter_updated = false;
		bool const was_finished = is_finished();
		for (auto const& p : pieces)
		{
			static_assert(std::is_unsigned<decltype(p.second)::underlying_type>::value
				, "we need assert p.second >= dont_download");
			TORRENT_ASSERT(p.second <= top_priority);
			TORRENT_ASSERT(p.first >= piece_index_t(0));
			TORRENT_ASSERT(p.first < m_torrent_file->end_piece());

			if (p.first < piece_index_t(0)
				|| p.first >= m_torrent_file->end_piece()
				|| p.second > top_priority)
			{
				static_assert(std::is_unsigned<decltype(p.second)::underlying_type>::value
					, "we need additional condition: p.second < dont_download");
				continue;
			}

			filter_updated |= m_picker->set_piece_priority(p.first, p.second);
		}
		update_gauge();
		if (filter_updated)
		{
			// we need to save this new state
			set_need_save_resume(torrent_handle::if_config_changed);

			update_peer_interest(was_finished);
		}

		state_updated();
	}